

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void lex_expect(Lexer *lxr,Tk expected)

{
  char *pcVar1;
  char *pcVar2;
  Err *err_00;
  Err *err;
  Lexer *pLStack_10;
  Tk expected_local;
  Lexer *lxr_local;
  
  if ((lxr->tk).type != expected) {
    err._4_4_ = expected;
    pLStack_10 = lxr;
    pcVar1 = tk_to_string((Tk *)((long)&err + 4));
    pcVar2 = tk_to_string(&(pLStack_10->tk).type);
    err_00 = err_new("expected %s, found %s",pcVar1,pcVar2);
    err_file(err_00,pLStack_10->path);
    err_00->line = (pLStack_10->tk).line;
    err_trigger(pLStack_10->vm,err_00);
  }
  return;
}

Assistant:

void lex_expect(Lexer *lxr, Tk expected) {
	if (lxr->tk.type != expected) {
		Err *err = err_new("expected %s, found %s", tk_to_string(&expected),
			tk_to_string(&lxr->tk.type));
		err_file(err, lxr->path);
		err->line = lxr->tk.line;
		err_trigger(lxr->vm, err);
	}
}